

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O2

void __thiscall
http_response_parsing_smoke02_Test::http_response_parsing_smoke02_Test
          (http_response_parsing_smoke02_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00156df8;
  return;
}

Assistant:

TEST(http_response_parsing, smoke02)
{
    sub_string str = sub_string::literal(
        "HTTP/1.1 200 OK" "\r\n"
        "Date: Wed, 23 Dec 2015 13:43:56 GMT" "\r\n"
        "Server: Server" "\r\n"
        "Set-Cookie: skin=noskin; path=/; domain=.amazon.com" "\r\n"
        "pragma: no-cache" "\r\n"
        "x-amz-id-1: 0WDRFNYP6K3XJ8VGHRBQ" "\r\n"
        "p3p: policyref=\"https://www.amazon.com/w3c/p3p.xml\",CP=\"CAO DSP LAW CUR ADM IVAo IVDo CONo OTPo OUR DELi PUBi OTRi BUS PHY ONL UNI PUR FIN COM NAV INT DEM CNT STA HEA PRE LOC GOV OTC \"" "\r\n"
        "cache-control: no-cache" "\r\n"
        "x-frame-options: SAMEORIGIN" "\r\n"
        "expires: -1" "\r\n"
        "Vary: Accept-Encoding,User-Agent,Avail-Dictionary" "\r\n"
        "Content-Encoding: gzip" "\r\n"
        "Content-Type: text/html; charset=UTF-8" "\r\n"
        "Set-cookie: ubid-main=190-5441568-7691748; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Set-cookie: session-id-time=2082787201l; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Set-cookie: session-id=178-4697370-5690842; path=/; domain=.amazon.com; expires=Tue, 01-Jan-2036 08:00:01 GMT" "\r\n"
        "Transfer-Encoding: chunked" "\r\n"
        "\r\n");
    http_response response = parse_response(str);
    EXPECT_TRUE(str.empty());
}